

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smprintf.c
# Opt level: O2

char * smprintf(char *fmt,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar3;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar2 = strlen(fmt);
  iVar3 = (int)sVar2 * 2 + 1;
  __s = (char *)malloc((long)iVar3);
  do {
    local_f8 = local_e8;
    local_100 = &ap[0].overflow_arg_area;
    local_108 = 0x3000000008;
    iVar1 = vsnprintf(__s,(long)iVar3,fmt,&local_108);
    if (iVar1 < iVar3) {
      if (iVar1 != iVar3 + -1 && -1 < iVar1) {
        return __s;
      }
      iVar3 = iVar3 * 2;
    }
    else {
      iVar3 = iVar1 + 1;
    }
    __s = (char *)realloc(__s,(long)iVar3);
  } while( true );
}

Assistant:

char *smprintf (const char *fmt, ...) {
	int m = strlen (fmt) * 2 + 1;
	char *buf = (char *) malloc (m);
	int didnt_fit;
	do {
		va_list ap;
		int x;
		va_start (ap, fmt);
		x = vsnprintf (buf, m, fmt, ap);
		va_end (ap);
		if (x >= m) {
			buf = (char *) realloc (buf, m = x+1);
			didnt_fit = 1;
		} else if (x < 0 || x == m-1) {
			buf = (char *) realloc (buf, m *= 2);
			didnt_fit = 1;
		} else {
			didnt_fit = 0;
		}
	} while (didnt_fit);
	return (buf);
}